

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test *this)

{
  bool bVar1;
  TestField *pTVar2;
  char *message;
  char *in_R9;
  string local_3e0;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  TestField elem;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestField::TestField((TestField *)&differencer.unpack_any_field_);
  proto2_unittest::TestField::set_a((TestField *)&differencer.unpack_any_field_,1);
  proto2_unittest::TestField::set_b((TestField *)&differencer.unpack_any_field_,1);
  proto2_unittest::TestField::set_c((TestField *)&differencer.unpack_any_field_,1);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)&differencer.unpack_any_field_);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)&differencer.unpack_any_field_);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)&differencer.unpack_any_field_);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::operator=(pTVar2,(TestField *)&differencer.unpack_any_field_);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::set_repeated_field_comparison
            ((MessageDifferencer *)&gtest_ar_.message_,AS_SMART_SET);
  local_3a9 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)&gtest_ar_.message_,
                         (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_180);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3e0,(internal *)local_3a8,(AssertionResult *)0x1ebd035,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x680,message);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  proto2_unittest::TestField::~TestField((TestField *)&differencer.unpack_any_field_);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartSetTest_IdenticalElements) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestField elem;

  elem.set_a(1);
  elem.set_b(1);
  elem.set_c(1);

  *msg1.add_rm() = elem;
  *msg1.add_rm() = elem;
  *msg2.add_rm() = elem;
  *msg2.add_rm() = elem;

  util::MessageDifferencer differencer;
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_SET);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}